

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LLexer.h
# Opt level: O1

void __thiscall LStringLexer::~LStringLexer(LStringLexer *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  (this->super_LLexer)._vptr_LLexer = (_func_int **)&PTR__LStringLexer_001225a0;
  pcVar2 = (this->str)._M_dataplus._M_p;
  paVar1 = &(this->str).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  operator_delete(this,0x38);
  return;
}

Assistant:

~LStringLexer() override = default;